

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::onMessage(Application *this)

{
  SessionID *in_RDX;
  NewOrderSingle *in_RSI;
  
  onMessage(this + -4,in_RSI,in_RDX);
  return;
}

Assistant:

void Application::onMessage(const FIX43::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX43::ExecutionReport executionReport = FIX43::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecType(FIX::ExecType_FILL),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);
  executionReport.set(symbol);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastQty(orderQty));
  executionReport.set(FIX::LastPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}